

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O0

void upb_Array_Delete(upb_Array *arr,size_t i,size_t count)

{
  _Bool _Var1;
  ulong src_idx;
  size_t end;
  size_t count_local;
  size_t i_local;
  upb_Array *arr_local;
  
  _Var1 = upb_Array_IsFrozen(arr);
  if (_Var1) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                  ,0x5e,"void upb_Array_Delete(upb_Array *, size_t, size_t)");
  }
  src_idx = i + count;
  if (i <= src_idx) {
    if (src_idx <= arr->size_dont_copy_me__upb_internal_use_only) {
      upb_Array_Move(arr,i,src_idx,arr->size_dont_copy_me__upb_internal_use_only - src_idx);
      arr->size_dont_copy_me__upb_internal_use_only =
           arr->size_dont_copy_me__upb_internal_use_only - count;
      return;
    }
    __assert_fail("end <= arr->size_dont_copy_me__upb_internal_use_only",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                  ,0x61,"void upb_Array_Delete(upb_Array *, size_t, size_t)");
  }
  __assert_fail("i <= end",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/message/array.c"
                ,0x60,"void upb_Array_Delete(upb_Array *, size_t, size_t)");
}

Assistant:

void upb_Array_Delete(upb_Array* arr, size_t i, size_t count) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  const size_t end = i + count;
  UPB_ASSERT(i <= end);
  UPB_ASSERT(end <= arr->UPB_PRIVATE(size));
  upb_Array_Move(arr, i, end, arr->UPB_PRIVATE(size) - end);
  arr->UPB_PRIVATE(size) -= count;
}